

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OplsTorsionType.hpp
# Opt level: O0

void __thiscall OpenMD::OplsTorsionType::~OplsTorsionType(OplsTorsionType *this)

{
  void *in_RDI;
  
  ~OplsTorsionType((OplsTorsionType *)0x29f0c8);
  operator_delete(in_RDI,0x50);
  return;
}

Assistant:

OplsTorsionType(RealType v1, RealType v2, RealType v3, bool trans180) :
        PolynomialTorsionType(), v1_(v1), v2_(v2), v3_(v3) {
      // convert OPLS Torsion Type to Polynomial Torsion type
      RealType c0 = v2 + 0.5 * (v1 + v3);
      RealType c1 = 0.5 * (v1 - 3.0 * v3);
      RealType c2 = -v2;
      RealType c3 = 2.0 * v3;

      if (!trans180) {
        c1 = -c1;
        c3 = -c3;
      }

      setCoefficient(0, c0);
      setCoefficient(1, c1);
      setCoefficient(2, c2);
      setCoefficient(3, c3);
    }